

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O3

void __thiscall r_exec::GMonitor::commit(GMonitor *this)

{
  SolutionList *pSVar1;
  _List_node_base *p_Var2;
  PrimaryMDLController *pPVar3;
  HLPBindingMap *pHVar4;
  bool bVar5;
  Goal *this_00;
  uint64_t now;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  float fVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  ulong uVar15;
  undefined1 auVar14 [16];
  long lStack_40;
  
  this_00 = _Fact::get_goal((_Fact *)(this->super__GMonitor).super_Monitor.target.object);
  now = (*Now)();
  for (p_Var7 = (this->super__GMonitor).sim_failures.mandatory_solutions.
                super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      (SimOutcomes *)p_Var7 != &(this->super__GMonitor).sim_failures; p_Var7 = p_Var7->_M_next) {
    bVar5 = Sim::is_invalidated(*(Sim **)((long)(p_Var7 + 1) + 8));
    if (!bVar5) {
      dVar9 = Goal::get_strength((Goal *)p_Var7[1]._M_next,now);
      dVar10 = Goal::get_strength(this_00,now);
      if (dVar10 < dVar9) goto LAB_00169758;
    }
  }
  for (p_Var7 = (this->super__GMonitor).sim_failures.optional_solutions.
                super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var7 != (_List_node_base *)&(this->super__GMonitor).sim_failures.optional_solutions;
      p_Var7 = p_Var7->_M_next) {
    bVar5 = Sim::is_invalidated((Sim *)p_Var7[1]._M_prev);
    if (!bVar5) {
      dVar9 = Goal::get_strength((Goal *)p_Var7[1]._M_next,now);
      dVar10 = Goal::get_strength(this_00,now);
      if (dVar10 < dVar9) {
        Sim::invalidate((Sim *)p_Var7[1]._M_prev);
      }
    }
  }
  pSVar1 = &(this->super__GMonitor).sim_successes.optional_solutions;
  p_Var7 = (this->super__GMonitor).sim_successes.optional_solutions.
           super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var7 != (_List_node_base *)pSVar1) {
    auVar11._8_4_ = (int)now;
    auVar11._0_8_ = now;
    auVar11._12_4_ = (int)(now >> 0x20);
    p_Var6 = (_List_node_base *)0x0;
    do {
      bVar5 = Sim::is_invalidated((Sim *)p_Var7[1]._M_prev);
      lStack_40 = auVar11._8_8_;
      if ((!bVar5) &&
         ((p_Var2 = p_Var7[1]._M_prev, p_Var6 == (_List_node_base *)0x0 ||
          (uVar13 = (long)p_Var2[4]._M_prev - now, uVar15 = (long)p_Var6[4]._M_prev - lStack_40,
          auVar14._0_8_ =
               ((double)(uVar13 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar13 & 0xffffffff | 0x4330000000000000),
          auVar14._8_8_ =
               ((double)(uVar15 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar15 & 0xffffffff | 0x4330000000000000), auVar12._8_8_ = p_Var6[4]._M_next
          , auVar12._0_8_ = p_Var2[4]._M_next, auVar12 = divpd(auVar12,auVar14),
          auVar12._8_8_ < auVar12._0_8_)))) {
        p_Var6 = p_Var2;
      }
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != (_List_node_base *)pSVar1);
    _GMonitor::invalidate_sim_outcomes(&this->super__GMonitor);
    if (p_Var6 != (_List_node_base *)0x0) {
      pPVar3 = (PrimaryMDLController *)p_Var7[1]._M_prev[3]._M_prev;
      p_Var7 = p_Var6[2]._M_prev;
      bVar5 = *(bool *)((long)&p_Var6[1]._M_prev + 1);
      pHVar4 = (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object;
      fVar8 = _Fact::get_cfd((this->super__GMonitor).goal_target);
      PrimaryMDLController::abduce(pPVar3,pHVar4,(Fact *)p_Var7,bVar5,(double)fVar8);
      for (p_Var7 = (this->super__GMonitor).sim_successes.mandatory_solutions.
                    super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          (SimOutcomes *)p_Var7 != &(this->super__GMonitor).sim_successes; p_Var7 = p_Var7->_M_next)
      {
        p_Var6 = *(_List_node_base **)((long)(p_Var7 + 1) + 8);
        p_Var2 = *(_List_node_base **)((long)(p_Var6 + 2) + 8);
        pPVar3 = *(PrimaryMDLController **)((long)(p_Var6 + 3) + 8);
        bVar5 = *(bool *)((long)(p_Var6 + 1) + 9);
        pHVar4 = (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object;
        fVar8 = _Fact::get_cfd((this->super__GMonitor).goal_target);
        PrimaryMDLController::abduce(pPVar3,pHVar4,(Fact *)p_Var2,bVar5,(double)fVar8);
      }
    }
    return;
  }
LAB_00169758:
  _GMonitor::invalidate_sim_outcomes(&this->super__GMonitor);
  return;
}

Assistant:

void GMonitor::commit()   // the purpose is to invalidate damaging simulations; if anything remains, commit to all mandatory simulations and to the best optional one.
{
    Goal *monitored_goal = target->get_goal();
    uint64_t now = Now();
    SolutionList::const_iterator sol;

    for (sol = sim_failures.mandatory_solutions.begin(); sol != sim_failures.mandatory_solutions.end(); ++sol) { // check if any mandatory solution could result in the failure of more important a goal.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) { // cave in.
            invalidate_sim_outcomes(); // this stops any further propagation of the goal simulation.
            return;
        }
    }

    for (sol = sim_failures.optional_solutions.begin(); sol != sim_failures.optional_solutions.end(); ++sol) { // check if any optional solutions could result in the failure of more important a goal; invalidate the culprits.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) {
            (*sol).second->invalidate();
        }
    }

    Sim *best_sol = nullptr;

    for (sol = sim_successes.optional_solutions.begin(); sol != sim_successes.optional_solutions.end(); ++sol) { // find the best optional solution left.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if (!best_sol) {
            best_sol = (*sol).second;
        } else {
            double s = (*sol).second->sol_cfd / ((*sol).second->sol_before - now);
            double _s = best_sol->sol_cfd / (best_sol->sol_before - now);

            if (s > _s) {
                best_sol = (*sol).second;
            }
        }
    }

    invalidate_sim_outcomes(); // this stops any further propagation of the goal simulation.

    if (best_sol) {
        ((PrimaryMDLController *)(*sol).second->sol)->abduce(bindings, best_sol->super_goal, best_sol->opposite, goal_target->get_cfd());

        for (sol = sim_successes.mandatory_solutions.begin(); sol != sim_successes.mandatory_solutions.end(); ++sol) { // commit to all mandatory solutions.
            ((PrimaryMDLController *)(*sol).second->sol)->abduce(bindings, (*sol).second->super_goal, (*sol).second->opposite, goal_target->get_cfd());
        }
    }
}